

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O0

Tuple4d * math::reflect(Tuple4d *__return_storage_ptr__,Tuple4d *in,Tuple4d *normal)

{
  double s;
  Tuple4d local_60;
  Tuple4d local_40;
  Tuple4d *local_20;
  Tuple4d *normal_local;
  Tuple4d *in_local;
  
  local_20 = normal;
  normal_local = in;
  in_local = __return_storage_ptr__;
  operator*(&local_60,normal,2.0);
  s = dot(normal_local,local_20);
  operator*(&local_40,&local_60,s);
  operator-(__return_storage_ptr__,in,&local_40);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d math::reflect(const math::Tuple4d &in, const math::Tuple4d &normal)
{
    return in - normal * 2 * dot(in, normal);
}